

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_576baf::TransformSelectorFor::TransformSelectorFor
          (TransformSelectorFor *this,int start,int stop,int step)

{
  allocator<char> local_41;
  string local_40;
  int local_1c;
  int local_18;
  int step_local;
  int stop_local;
  int start_local;
  TransformSelectorFor *this_local;
  
  local_1c = step;
  local_18 = stop;
  step_local = start;
  _stop_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"FOR",&local_41);
  TransformSelectorIndexes::TransformSelectorIndexes
            (&this->super_TransformSelectorIndexes,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  (this->super_TransformSelectorIndexes).super_TransformSelector._vptr_TransformSelector =
       (_func_int **)&PTR__TransformSelectorFor_009d7ad0;
  this->Start = step_local;
  this->Stop = local_18;
  this->Step = local_1c;
  return;
}

Assistant:

TransformSelectorFor(int start, int stop, int step)
    : TransformSelectorIndexes("FOR")
    , Start(start)
    , Stop(stop)
    , Step(step)
  {
  }